

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O0

TSSymbol ts_language_symbol_for_name(TSLanguage *self,char *name)

{
  int iVar1;
  uint32_t uVar2;
  ushort local_26;
  TSSymbol i;
  uint32_t count;
  char *name_local;
  TSLanguage *self_local;
  
  iVar1 = strcmp(name,"ERROR");
  if (iVar1 == 0) {
    self_local._6_2_ = 0xffff;
  }
  else {
    uVar2 = ts_language_symbol_count(self);
    for (local_26 = 0; local_26 < uVar2; local_26 = local_26 + 1) {
      iVar1 = strcmp(self->symbol_names[local_26],name);
      if (iVar1 == 0) {
        return local_26;
      }
    }
    self_local._6_2_ = 0;
  }
  return self_local._6_2_;
}

Assistant:

TSSymbol ts_language_symbol_for_name(const TSLanguage *self, const char *name) {
  if (!strcmp(name, "ERROR")) return ts_builtin_sym_error;

  uint32_t count = ts_language_symbol_count(self);
  for (TSSymbol i = 0; i < count; i++) {
    if (!strcmp(self->symbol_names[i], name)) {
      return i;
    }
  }
  return 0;
}